

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

void __thiscall soplex::LPColSetBase<double>::~LPColSetBase(LPColSetBase<double> *this)

{
  LPColSetBase<double> *in_RDI;
  
  ~LPColSetBase(in_RDI);
  operator_delete(in_RDI,200);
  return;
}

Assistant:

virtual ~LPColSetBase()
   {}